

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  long lVar2;
  ostream *poVar3;
  char *pcVar4;
  ProgramOptions *this;
  allocator local_a1;
  char *end;
  ProgramOptions po;
  
  po.input_file._M_dataplus._M_p = (pointer)&po.input_file.field_2;
  po.input_file._M_string_length = 0;
  po.input_file.field_2._M_local_buf[0] = '\0';
  po.output_file._M_dataplus._M_p = (pointer)&po.output_file.field_2;
  po.output_file._M_string_length = 0;
  po.output_file.field_2._M_local_buf[0] = '\0';
  po.generate_example = false;
  po.generate_benchmark = false;
  po.plot_outputs = false;
  po.clusters = 4;
  po.scaling_factor = 1e-05;
  po.threshold_iters = 0x40;
  po.features = 2;
  po.vectors = 0x400;
  if (argc == 1) {
    ProgramOptions::usage(argv);
  }
LAB_00102540:
  iVar1 = getopt(argc,argv,"hi:o:k:t:s:pebf:v:");
  pcVar4 = "Some invalid option was supplied.";
  switch(iVar1) {
  case 0x62:
    po.generate_benchmark = true;
    goto LAB_00102540;
  case 99:
  case 100:
  case 0x67:
  case 0x6a:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x71:
  case 0x72:
  case 0x75:
    goto switchD_0010256e_caseD_63;
  case 0x65:
    po.generate_example = true;
    goto LAB_00102540;
  case 0x66:
    po.features = strtol(_optarg,&end,10);
    goto LAB_00102540;
  case 0x68:
    goto switchD_0010256e_caseD_68;
  case 0x69:
    std::__cxx11::string::string((string *)&end,_optarg,&local_a1);
    this = &po;
    break;
  case 0x6b:
    lVar2 = strtol(_optarg,&end,10);
    po.clusters = (uint)lVar2;
    goto LAB_00102540;
  case 0x6f:
    std::__cxx11::string::string((string *)&end,_optarg,&local_a1);
    this = (ProgramOptions *)&po.output_file;
    break;
  case 0x70:
    po.plot_outputs = true;
    goto LAB_00102540;
  case 0x73:
    po.scaling_factor = strtof(_optarg,&end);
    goto LAB_00102540;
  case 0x74:
    lVar2 = strtol(_optarg,&end,10);
    po.threshold_iters = (uint)lVar2;
    goto LAB_00102540;
  case 0x76:
    po.vectors = strtol(_optarg,&end,10);
    goto LAB_00102540;
  default:
    if (iVar1 != 0x3f) {
      if (iVar1 == -1) {
        ProgramOptions::run(&po);
        ProgramOptions::~ProgramOptions(&po);
        return 0;
      }
      goto switchD_0010256e_caseD_63;
    }
    pcVar4 = "Options -i and -o require an argument.";
    if ((_optopt == 0x6f) || (_optopt == 0x69)) {
switchD_0010256e_caseD_63:
      poVar3 = std::operator<<((ostream *)&std::cerr,pcVar4);
      std::endl<char,std::char_traits<char>>(poVar3);
      goto switchD_0010256e_caseD_68;
    }
    goto LAB_00102540;
  }
  std::__cxx11::string::operator=((string *)this,(string *)&end);
  std::__cxx11::string::~string((string *)&end);
  goto LAB_00102540;
switchD_0010256e_caseD_68:
  ProgramOptions::usage(argv);
  goto LAB_00102540;
}

Assistant:

int main(int argc, char *argv[]) {

  ProgramOptions po;

  if (argc == 1) {
    ProgramOptions::usage(argv);
  }

  // Use GNU getopt to parse command line options
  int opt;
  while ((opt = getopt(argc, argv, "hi:o:k:t:s:pebf:v:")) != -1) {
    switch (opt) {

      case 'h': {
        ProgramOptions::usage(argv);
        break;
      }

      case 'i': {
        po.input_file = std::string(optarg);
        break;
      }

      case 'o': {
        po.output_file = std::string(optarg);
        break;
      }

      case 'k': {
        char *end;
        po.clusters = (unsigned int) std::strtol(optarg, &end, 10);
        break;
      }

      case 't': {
        char *end;
        po.threshold_iters = (unsigned int) std::strtol(optarg, &end, 10);
        break;
      }

      case 'f': {
        char *end;
        po.features = (unsigned long) std::strtol(optarg, &end, 10);
        break;
      }

      case 'v': {
        char *end;
        po.vectors = (unsigned long) std::strtol(optarg, &end, 10);
        break;
      }

      case 's': {
        char *end;
        po.scaling_factor = std::strtof(optarg, &end);
        break;
      }

      case 'p': {
        po.plot_outputs = true;
        break;
      }

      case 'e': {
        po.generate_example = true;
        break;
      }

      case 'b': {
        po.generate_benchmark = true;
        break;
      }

      case '?':
        if ((optopt == 'i') || (optopt == 'o')) {
          std::cerr << "Options -i and -o require an argument." << std::endl;
          ProgramOptions::usage(argv);
        }
        break;

      default: {
        std::cerr << "Some invalid option was supplied." << std::endl;
        ProgramOptions::usage(argv);
        break;
      }

    }
  }

  po.run();

  return 0;
}